

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampUnusedChannelCase::getIteration
          (IterationConfig *__return_storage_ptr__,TextureBorderClampUnusedChannelCase *this,int ndx
          )

{
  const_reference pvVar1;
  int ndx_local;
  TextureBorderClampUnusedChannelCase *this_local;
  
  pvVar1 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ::operator[](&this->m_iterations,(long)ndx);
  TextureBorderClampTest::IterationConfig::IterationConfig(__return_storage_ptr__,pvVar1);
  return __return_storage_ptr__;
}

Assistant:

TextureBorderClampTest::IterationConfig TextureBorderClampUnusedChannelCase::getIteration (int ndx) const
{
	return m_iterations[ndx];
}